

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_snap_functions.cc
# Opt level: O2

void __thiscall
s2builderutil::IdentitySnapFunction::set_snap_radius(IdentitySnapFunction *this,S1Angle snap_radius)

{
  S2LogMessage SStack_18;
  
  if (snap_radius.radians_ <= 1.2217304763960306) {
    (this->snap_radius_).radians_ = snap_radius.radians_;
    return;
  }
  S2LogMessage::S2LogMessage
            (&SStack_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_snap_functions.cc"
             ,0x32,kFatal,(ostream *)&std::cerr);
  std::operator<<(SStack_18.stream_,"Check failed: (snap_radius) <= (kMaxSnapRadius()) ");
  abort();
}

Assistant:

void IdentitySnapFunction::set_snap_radius(S1Angle snap_radius) {
  S2_DCHECK_LE(snap_radius, kMaxSnapRadius());
  snap_radius_ = snap_radius;
}